

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O1

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,close_status_code status)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  span<const_unsigned_char,__1L> *in_R9;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar4;
  long *in_FS_OFFSET;
  uint16_t ns;
  ushort local_52;
  http *local_50;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *local_48;
  extent_type<_1L> local_40;
  ushort *local_38;
  
  local_50 = this;
  local_48 = sender;
  pstore::details::log_destinations::__tls_init();
  lVar1 = *in_FS_OFFSET;
  if (*(long *)(lVar1 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    plVar2 = *(long **)(lVar1 + -8);
    puVar4 = (undefined8 *)*plVar2;
    puVar3 = (undefined8 *)plVar2[1];
    if (puVar4 != puVar3) {
      do {
        (**(code **)(*(long *)*puVar4 + 0x18))
                  ((long *)*puVar4,6,"Sending close frame code=",(ulong)io._M_data & 0xffff);
        puVar4 = puVar4 + 1;
      } while (puVar4 != puVar3);
    }
  }
  local_52 = (ushort)io._M_data << 8 | (ushort)io._M_data >> 8;
  pstore::gsl::details::extent_type<-1L>::extent_type(&local_40,2);
  local_38 = &local_52;
  send_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (__return_storage_ptr__,local_50,local_48,
             (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
              )0x8,(opcode)&local_40,in_R9);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_close_frame (Sender const sender, IO const io,
                                       close_status_code const status) {
            log (logger::priority::info,
                 "Sending close frame code=", static_cast<std::uint16_t> (status));
            PSTORE_STATIC_ASSERT ((
                std::is_same<std::underlying_type<close_status_code>::type, std::uint16_t>::value));
            std::uint16_t const ns = host_to_network (static_cast<std::uint16_t> (status));
            return send_message (sender, io, opcode::close, as_bytes (gsl::make_span (&ns, 1)));
        }